

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfQueue.c
# Opt level: O0

void sbfQueue_dispatch(sbfQueue queue)

{
  sbfQueue queue_00;
  sbfQueue in_RDI;
  sbfQueueItem item;
  
  sbfQueue_addRef((sbfQueue)0x104813);
  sbfLog_log(in_RDI->mLog,0,"queue %p entered",in_RDI);
  do {
    queue_00 = (sbfQueue)sbfQueueDequeue(in_RDI);
    if (queue_00 != (sbfQueue)0x0) {
      if ((sbfQueueCb)queue_00->mName != (sbfQueueCb)0x0) {
        (*(code *)queue_00->mName)((sbfQueueItem)queue_00,queue_00->mLog);
      }
      sbfPool_put(queue_00);
      if ((sbfQueueCb)queue_00->mName == (sbfQueueCb)0x0) {
        sbfQueue_removeRef((sbfQueue)0x1048c0);
        sbfLog_log(in_RDI->mLog,0,"queue %p exited",in_RDI);
        sbfQueue_removeRef((sbfQueue)0x1048fb);
        return;
      }
    }
    sbfHiResTimer_queueDispatch(queue_00);
  } while( true );
}

Assistant:

void
sbfQueue_dispatch (sbfQueue queue)
{
    sbfQueueItem item;

    sbfQueue_addRef (queue);
    sbfLog_debug (queue->mLog, "queue %p entered", queue);

    for (;;)
    {
        item = sbfQueueDequeue (queue);
        if (SBF_LIKELY (item != NULL))
        {
            if (SBF_LIKELY (item->mCb != NULL))
                item->mCb (item, item->mClosure);
            sbfPool_put (item);
            if (SBF_UNLIKELY (item->mCb == NULL))
            {
                sbfQueue_removeRef (queue);
                break; /* NULL callback means destroyed */
            }
        }
        sbfHiResTimer_queueDispatch (queue);
    }

    sbfLog_debug (queue->mLog, "queue %p exited", queue);
    sbfQueue_removeRef (queue);
}